

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O0

void generateChessTexture
               (PatternGeneration *pattern_generation,uint *resolution,uint *i,string *textures_dir,
               string *scripts_dir)

{
  byte bVar1;
  result_type rVar2;
  ostream *poVar3;
  vector<int,_std::allocator<int>_> local_28d8;
  _InputArray local_28b8;
  Scalar_ local_28a0 [8];
  Mat chess_board;
  undefined1 local_2840 [8];
  Scalar chess_color_2;
  undefined1 local_2820 [8];
  Scalar chess_color_1;
  int block_size;
  int squares;
  uniform_int_distribution<int> dist;
  mt19937 mt;
  random_device rd;
  string local_c0 [48];
  string local_90 [8];
  string img_filename;
  string local_70 [8];
  string img_name;
  string local_50 [8];
  string material_name;
  string *scripts_dir_local;
  string *textures_dir_local;
  uint *i_local;
  uint *resolution_local;
  PatternGeneration *pattern_generation_local;
  
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::string(local_90);
  genNames("chess_",*i,textures_dir,(string *)local_50,(string *)local_70,(string *)local_90);
  std::__cxx11::string::string(local_c0,local_50);
  std::__cxx11::string::string((string *)((long)&rd.field_0 + 0x1380),local_70);
  genScript((string *)local_c0,(string *)((long)&rd.field_0 + 0x1380),scripts_dir);
  std::__cxx11::string::~string((string *)((long)&rd.field_0 + 0x1380));
  std::__cxx11::string::~string(local_c0);
  std::random_device::random_device((random_device *)&mt._M_p);
  rVar2 = std::random_device::operator()((random_device *)&mt._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&dist,(ulong)rVar2);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&block_size);
  std::uniform_int_distribution<int>::operator()
            ((uniform_int_distribution<int> *)&block_size,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&dist);
  PatternGeneration::getRandomColor();
  PatternGeneration::getRandomColor();
  PatternGeneration::getChessTexture
            (local_28a0,(Scalar_ *)pattern_generation,(int)local_2820,(int)local_2840);
  cv::_InputArray::_InputArray(&local_28b8,(Mat *)local_28a0);
  local_28d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_28d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_28d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_28d8);
  bVar1 = cv::imwrite(local_90,&local_28b8,(vector *)&local_28d8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_28d8);
  cv::_InputArray::~_InputArray(&local_28b8);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    cv::Mat::~Mat((Mat *)local_28a0);
    std::random_device::~random_device((random_device *)&mt._M_p);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"[ERROR] Could not save ");
  poVar3 = std::operator<<(poVar3,local_90);
  poVar3 = std::operator<<(poVar3,". Please ensure the destination folder exists!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void generateChessTexture(PatternGeneration & pattern_generation,
    unsigned int & resolution,
    const unsigned int & i,
    std::string & textures_dir,
    std::string & scripts_dir)
{
    std::string material_name, img_name, img_filename;
    genNames("chess_", i, textures_dir, material_name, img_name, img_filename);
    genScript(material_name, img_name, scripts_dir);
    if (!GENERATE_IMG) return;

    /* Initialize random device */
    std::random_device rd;
    std::mt19937 mt(rd());
    std::uniform_int_distribution<int> dist;
    int squares;
    int block_size;
    /* Generate square texture */
    squares = dist(mt) % 20 + 8;     // v2 in the range 1 to 100
    block_size = resolution / squares;
    if (block_size % 2 == 0)
        block_size++;

    cv::Scalar chess_color_1    = pattern_generation.getRandomColor();
    cv::Scalar chess_color_2    = pattern_generation.getRandomColor();

    cv::Mat chess_board = pattern_generation.getChessTexture(chess_color_1, chess_color_2, block_size, squares);

    // Convert to HSV
    //cv::applyColorMap(chess_board, chess_board, cv::COLORMAP_LAB);

    if (!cv::imwrite(img_filename, chess_board)){
        std::cout << "[ERROR] Could not save " << img_filename <<
        ". Please ensure the destination folder exists!" << std::endl;
        exit(EXIT_FAILURE);
    }

    if (SHOW_IMGS)
        cv::imshow("Chess board", chess_board);

}